

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

Read<long> __thiscall
Omega_h::Dist::exch_reduce<long>(Dist *this,Read<long> *data,Int width,Omega_h_Op op)

{
  undefined4 in_register_00000014;
  void *extraout_RDX;
  Omega_h_Op in_R8D;
  Read<long> RVar1;
  Read<long> local_78;
  Read<int> local_68 [2];
  Read<long> local_48;
  undefined1 local_38 [8];
  Read<long> item_data;
  Omega_h_Op op_local;
  Int width_local;
  Read<long> *data_local;
  Dist *this_local;
  
  item_data.write_.shared_alloc_.direct_ptr._0_4_ = in_R8D;
  item_data.write_.shared_alloc_.direct_ptr._4_4_ = op;
  Read<long>::Read(&local_48,(Read<int> *)CONCAT44(in_register_00000014,width));
  exch<long>((Dist *)local_38,data,(Int)&local_48);
  Read<long>::~Read(&local_48);
  Read<int>::Read(local_68,(Read<int> *)(data + 2));
  Read<long>::Read(&local_78,(Read<int> *)local_38);
  fan_reduce<long>((Omega_h *)this,local_68,(Read<signed_char> *)&local_78,
                   item_data.write_.shared_alloc_.direct_ptr._4_4_,
                   (Omega_h_Op)item_data.write_.shared_alloc_.direct_ptr);
  Read<long>::~Read(&local_78);
  Read<int>::~Read(local_68);
  Read<long>::~Read((Read<long> *)local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> Dist::exch_reduce(Read<T> data, Int width, Omega_h_Op op) const {
  Read<T> item_data = exch(data, width);
  return fan_reduce(roots2items_[R], item_data, width, op);
}